

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gauden.c
# Opt level: O0

void gauden_free_acc(gauden_t *g)

{
  gauden_t *g_local;
  
  if (g->macc != (vector_t ***)0x0) {
    gauden_free_param(g->macc);
  }
  g->macc = (vector_t ***)0x0;
  if (g->vacc != (vector_t ***)0x0) {
    gauden_free_param(g->vacc);
  }
  g->vacc = (vector_t ***)0x0;
  if (g->fullvacc != (vector_t ****)0x0) {
    gauden_free_param_full(g->fullvacc);
  }
  g->fullvacc = (vector_t ****)0x0;
  if (g->dnom != (float32 ***)0x0) {
    ckd_free_3d(g->dnom);
  }
  g->dnom = (float32 ***)0x0;
  return;
}

Assistant:

void
gauden_free_acc(gauden_t *g)
{
    if (g->macc) {
	gauden_free_param(g->macc);
    }
    g->macc = NULL;

    if (g->vacc) {
	gauden_free_param(g->vacc);
    }
    g->vacc = NULL;

    if (g->fullvacc) {
	gauden_free_param_full(g->fullvacc);
    }
    g->fullvacc = NULL;

    if (g->dnom) {
	ckd_free_3d((void ***)g->dnom);
    }
    g->dnom = NULL;
}